

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  long lVar1;
  once_flag *poVar2;
  bool bVar3;
  Descriptor *pDVar4;
  EnumDescriptor *pEVar5;
  long *plVar6;
  long *plVar7;
  FieldDescriptor *pFVar8;
  _func_void_FieldDescriptor_ptr *p_Var9;
  long lVar10;
  long lVar11;
  FieldDescriptor *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  _func_void_FieldDescriptor_ptr *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0 < *(int *)(message + 0x68)) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      lVar1 = *(long *)(message + 0x28);
      pFVar8 = (FieldDescriptor *)(lVar10 + lVar1);
      poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar10);
      if (poVar2 != (once_flag *)0x0) {
        local_d0 = FieldDescriptor::TypeOnceInit;
        local_f0 = pFVar8;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar2,&local_d0,&local_f0);
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x38 + lVar10) * 4
                   ) == 10) &&
         (pDVar4 = FieldDescriptor::message_type(pFVar8),
         *(FileDescriptor **)(pDVar4 + 0x10) == file)) {
LAB_0028050f:
        std::operator+(&local_50,"proto3 message field ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + 8 + lVar10));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar6[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
          local_b0 = (long *)*plVar6;
        }
        local_a8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,**(ulong **)file);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
          local_70 = (long *)*plVar6;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_70,**(ulong **)file);
        pFVar8 = (FieldDescriptor *)(plVar6 + 2);
        if ((FieldDescriptor *)*plVar6 == pFVar8) {
          local_e0 = *(long *)pFVar8;
          lStack_d8 = plVar6[3];
          local_f0 = (FieldDescriptor *)&local_e0;
        }
        else {
          local_e0 = *(long *)pFVar8;
          local_f0 = (FieldDescriptor *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)pFVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
        p_Var9 = (_func_void_FieldDescriptor_ptr *)(plVar6 + 2);
        if ((_func_void_FieldDescriptor_ptr *)*plVar6 == p_Var9) {
          local_c0 = *(long *)p_Var9;
          lStack_b8 = plVar6[3];
          local_d0 = (_func_void_FieldDescriptor_ptr *)&local_c0;
        }
        else {
          local_c0 = *(long *)p_Var9;
          local_d0 = (_func_void_FieldDescriptor_ptr *)*plVar6;
        }
        local_c8 = plVar6[1];
        *plVar6 = (long)p_Var9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)error,(string *)&local_d0);
        if (local_d0 != (_func_void_FieldDescriptor_ptr *)&local_c0) {
          operator_delete(local_d0);
        }
        if (local_f0 != (FieldDescriptor *)&local_e0) {
          operator_delete(local_f0);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        return true;
      }
      poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar10);
      if (poVar2 != (once_flag *)0x0) {
        local_d0 = FieldDescriptor::TypeOnceInit;
        local_f0 = pFVar8;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar2,&local_d0,&local_f0);
      }
      if ((*(int *)(lVar1 + 0x38 + lVar10) == 0xe) &&
         (pEVar5 = FieldDescriptor::enum_type(pFVar8), *(FileDescriptor **)(pEVar5 + 0x10) == file))
      goto LAB_0028050f;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x98;
    } while (lVar11 < *(int *)(message + 0x68));
  }
  if (*(int *)(message + 0x70) < 1) {
    bVar3 = false;
  }
  else {
    lVar10 = 0;
    lVar11 = 0;
    do {
      bVar3 = UsesTypeFromFile((Descriptor *)(*(long *)(message + 0x38) + lVar10),file,error);
      if (bVar3) {
        return bVar3;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x90;
    } while (lVar11 < *(int *)(message + 0x70));
  }
  return bVar3;
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}